

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O3

void MatrixPrint(Matrix *a)

{
  char *pcVar1;
  uint32_t rows;
  uint uVar2;
  Matrix *a_00;
  
  putchar(0x7b);
  if (a->rows != 0) {
    a_00 = (Matrix *)0x0;
    do {
      putchar(0x7b);
      uVar2 = a->columns;
      if (uVar2 != 0) {
        rows = 0;
        do {
          pcVar1 = "%Lf";
          if (rows < uVar2 - 1) {
            pcVar1 = "%Lf,";
          }
          MatrixGetElement((Real *)a,a_00,rows,0x10a4da);
          printf(pcVar1);
          rows = rows + 1;
          uVar2 = a->columns;
        } while (rows < uVar2);
      }
      pcVar1 = "}";
      if ((uint)a_00 < a->rows - 1) {
        pcVar1 = "},";
      }
      printf("%s",pcVar1);
      uVar2 = (uint)a_00 + 1;
      a_00 = (Matrix *)(ulong)uVar2;
    } while (uVar2 < a->rows);
  }
  puts("}");
  return;
}

Assistant:

void MatrixPrint(const Matrix *a) {
  printf("{");
  for (uint32_t row = 0; row < a->rows; ++row) {
    printf("{");
    for (uint32_t col = 0; col < a->columns; ++col) {
      printf(col < a->columns - 1 ? "%Lf," : "%Lf", MatrixGetElement(a, row, col));
    }
    printf("%s", row < a->rows - 1 ? "}," : "}");
  }
  printf("}\n");
}